

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O1

cs_err ARM_option(cs_struct *handle,cs_opt_type type,size_t value)

{
  code *pcVar1;
  cs_mode value_00;
  
  value_00 = (cs_mode)value;
  if (type == CS_OPT_SYNTAX) {
    ARM_getRegName(handle,value_00);
    handle->syntax = value_00;
  }
  else if (type == CS_OPT_MODE) {
    if ((value & 0x10) == 0) {
      pcVar1 = ARM_getInstruction;
    }
    else {
      pcVar1 = Thumb_getInstruction;
    }
    handle->disasm = pcVar1;
    handle->mode = value_00;
  }
  return CS_ERR_OK;
}

Assistant:

cs_err ARM_option(cs_struct *handle, cs_opt_type type, size_t value)
{
	switch(type) {
		case CS_OPT_MODE:
			if (value & CS_MODE_THUMB)
				handle->disasm = Thumb_getInstruction;
			else
				handle->disasm = ARM_getInstruction;

			handle->mode = (cs_mode)value;

			break;
		case CS_OPT_SYNTAX:
			ARM_getRegName(handle, (int)value);
			handle->syntax = (int)value;
			break;
		default:
			break;
	}

	return CS_ERR_OK;
}